

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

CollSeq * sqlite3ExprCollSeq(Parse *pParse,Expr *pExpr)

{
  u8 uVar1;
  sqlite3 *db_00;
  int iVar2;
  int local_4c;
  Expr *pEStack_48;
  int i;
  Expr *pNext;
  char *zColl;
  int j;
  int op;
  Expr *p;
  CollSeq *pColl;
  sqlite3 *db;
  Expr *pExpr_local;
  Parse *pParse_local;
  
  db_00 = pParse->db;
  p = (Expr *)0x0;
  _j = pExpr;
  while( true ) {
    while( true ) {
      if ((_j == (Expr *)0x0) || (uVar1 = _j->op, (_j->flags & 0x200) != 0)) goto LAB_001730be;
      if ((uVar1 != 'B') && (uVar1 != 0x9c)) break;
      _j = _j->pLeft;
    }
    if ((uVar1 == '5') || ((uVar1 == 0x9d && (_j->op2 == '5')))) break;
    if (((((uVar1 == 0x9a) || (uVar1 == 0x98)) || (uVar1 == 0x9d)) || (uVar1 == 'X')) &&
       (_j->pTab != (Table *)0x0)) {
      if (-1 < _j->iColumn) {
        p = (Expr *)sqlite3FindCollSeq(db_00,db_00->enc,_j->pTab->aCol[(int)_j->iColumn].zColl,0);
      }
      goto LAB_001730be;
    }
    if ((_j->flags & 0x100) == 0) goto LAB_001730be;
    if ((_j->pLeft == (Expr *)0x0) || ((_j->pLeft->flags & 0x100) == 0)) {
      pEStack_48 = _j->pRight;
      if (((_j->x).pList != (ExprList *)0x0) && ((_j->flags & 0x800) == 0)) {
        for (local_4c = 0; local_4c < ((_j->x).pList)->nExpr; local_4c = local_4c + 1) {
          if (((((_j->x).pList)->a[local_4c].pExpr)->flags & 0x100) != 0) {
            pEStack_48 = ((_j->x).pList)->a[local_4c].pExpr;
            break;
          }
        }
      }
      _j = pEStack_48;
    }
    else {
      _j = _j->pLeft;
    }
  }
  p = (Expr *)sqlite3GetCollSeq(pParse,db_00->enc,(CollSeq *)0x0,(_j->u).zToken);
LAB_001730be:
  iVar2 = sqlite3CheckCollSeq(pParse,(CollSeq *)p);
  if (iVar2 != 0) {
    p = (Expr *)0x0;
  }
  return (CollSeq *)p;
}

Assistant:

SQLITE_PRIVATE CollSeq *sqlite3ExprCollSeq(Parse *pParse, Expr *pExpr){
  sqlite3 *db = pParse->db;
  CollSeq *pColl = 0;
  Expr *p = pExpr;
  while( p ){
    int op = p->op;
    if( p->flags & EP_Generic ) break;
    if( op==TK_CAST || op==TK_UPLUS ){
      p = p->pLeft;
      continue;
    }
    if( op==TK_COLLATE || (op==TK_REGISTER && p->op2==TK_COLLATE) ){
      pColl = sqlite3GetCollSeq(pParse, ENC(db), 0, p->u.zToken);
      break;
    }
    if( (op==TK_AGG_COLUMN || op==TK_COLUMN
          || op==TK_REGISTER || op==TK_TRIGGER)
     && p->pTab!=0
    ){
      /* op==TK_REGISTER && p->pTab!=0 happens when pExpr was originally
      ** a TK_COLUMN but was previously evaluated and cached in a register */
      int j = p->iColumn;
      if( j>=0 ){
        const char *zColl = p->pTab->aCol[j].zColl;
        pColl = sqlite3FindCollSeq(db, ENC(db), zColl, 0);
      }
      break;
    }
    if( p->flags & EP_Collate ){
      if( p->pLeft && (p->pLeft->flags & EP_Collate)!=0 ){
        p = p->pLeft;
      }else{
        Expr *pNext  = p->pRight;
        /* The Expr.x union is never used at the same time as Expr.pRight */
        assert( p->x.pList==0 || p->pRight==0 );
        /* p->flags holds EP_Collate and p->pLeft->flags does not.  And
        ** p->x.pSelect cannot.  So if p->x.pLeft exists, it must hold at
        ** least one EP_Collate. Thus the following two ALWAYS. */
        if( p->x.pList!=0 && ALWAYS(!ExprHasProperty(p, EP_xIsSelect)) ){
          int i;
          for(i=0; ALWAYS(i<p->x.pList->nExpr); i++){
            if( ExprHasProperty(p->x.pList->a[i].pExpr, EP_Collate) ){
              pNext = p->x.pList->a[i].pExpr;
              break;
            }
          }
        }
        p = pNext;
      }
    }else{
      break;
    }
  }
  if( sqlite3CheckCollSeq(pParse, pColl) ){ 
    pColl = 0;
  }
  return pColl;
}